

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retLvalue.c
# Opt level: O1

void Abc_ManCollectLatches_rec(Abc_Obj_t *pObj,Vec_Ptr_t *vLatches)

{
  int iVar1;
  uint uVar2;
  Abc_Ntk_t *pAVar3;
  Abc_Ntk_t *pAVar4;
  long *plVar5;
  void **ppvVar6;
  int in_EDX;
  int Fill;
  int iVar7;
  
  if ((*(uint *)&pObj->field_0x14 & 0xf) != 8) {
    return;
  }
  pAVar3 = pObj->pNtk;
  iVar7 = pObj->Id;
  Vec_IntFillExtra(&pAVar3->vTravIds,iVar7 + 1,in_EDX);
  if (((long)iVar7 < 0) || ((pAVar3->vTravIds).nSize <= iVar7)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pAVar4 = pObj->pNtk;
  iVar1 = pAVar4->nTravIds;
  if ((pAVar3->vTravIds).pArray[iVar7] == iVar1) {
    return;
  }
  iVar7 = pObj->Id;
  Vec_IntFillExtra(&pAVar4->vTravIds,iVar7 + 1,Fill);
  if (((long)iVar7 < 0) || ((pAVar4->vTravIds).nSize <= iVar7)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  (pAVar4->vTravIds).pArray[iVar7] = iVar1;
  plVar5 = (long *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray];
  plVar5 = *(long **)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) + (long)*(int *)plVar5[4] * 8);
  if ((*(uint *)((long)plVar5 + 0x14) & 0xf) == 5) {
    Abc_ManCollectLatches_rec
              (*(Abc_Obj_t **)
                (*(long *)(*(long *)(*plVar5 + 0x20) + 8) + (long)*(int *)plVar5[4] * 8),vLatches);
  }
  uVar2 = vLatches->nCap;
  if (vLatches->nSize == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (vLatches->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc(0x80);
      }
      else {
        ppvVar6 = (void **)realloc(vLatches->pArray,0x80);
      }
      vLatches->pArray = ppvVar6;
      iVar7 = 0x10;
    }
    else {
      iVar7 = uVar2 * 2;
      if (iVar7 <= (int)uVar2) goto LAB_0047362d;
      if (vLatches->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc((ulong)uVar2 << 4);
      }
      else {
        ppvVar6 = (void **)realloc(vLatches->pArray,(ulong)uVar2 << 4);
      }
      vLatches->pArray = ppvVar6;
    }
    vLatches->nCap = iVar7;
  }
LAB_0047362d:
  iVar7 = vLatches->nSize;
  vLatches->nSize = iVar7 + 1;
  vLatches->pArray[iVar7] = pObj;
  return;
}

Assistant:

void Abc_ManCollectLatches_rec( Abc_Obj_t * pObj, Vec_Ptr_t * vLatches )
{
    Abc_Obj_t * pDriver;
    if ( !Abc_ObjIsLatch(pObj) )
        return;
    // skip already collected latches
    if ( Abc_NodeIsTravIdCurrent(pObj)  )
        return;
    Abc_NodeSetTravIdCurrent(pObj);
    // get the driver node feeding into the latch
    pDriver = Abc_ObjFanin0(Abc_ObjFanin0(pObj));
    // call recursively if the driver looks like a latch output
    if ( Abc_ObjIsBo(pDriver) )
        Abc_ManCollectLatches_rec( Abc_ObjFanin0(pDriver), vLatches );
    // collect the latch
    Vec_PtrPush( vLatches, pObj );
}